

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::anon_unknown_0::PortBackrefVisitor::visit<slang::ast::RealLiteral>
          (PortBackrefVisitor *this,RealLiteral *expr)

{
  Expression *in_RSI;
  PortSymbol *in_RDI;
  ValueSymbol *unaff_retaddr;
  
  if (in_RSI->kind == NamedValue) {
    Expression::as<slang::ast::NamedValueExpression>(in_RSI);
    ValueSymbol::addPortBackref(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    expr.template as<NamedValueExpression>().symbol.addPortBackref(port);
                    break;
                default:
                    if constexpr (HasVisitExprs<T, PortBackrefVisitor>) {
                        expr.visitExprs(*this);
                    }
                    break;
            }
        }
    }